

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerOpenWal(Pager *pPager)

{
  sqlite3_vfs *psVar1;
  char *pcVar2;
  i64 iVar3;
  sqlite3_file *psVar4;
  int iVar5;
  uint uVar6;
  Wal *pWal;
  u8 uVar7;
  uint local_3c;
  sqlite3_file *local_38;
  
  if (pPager->exclusiveMode == '\0') {
    uVar7 = '\0';
  }
  else {
    iVar5 = pagerExclusiveLock(pPager);
    if (iVar5 != 0) goto LAB_0014a257;
    uVar7 = (pPager->exclusiveMode != '\0') * '\x02';
  }
  psVar1 = pPager->pVfs;
  local_38 = pPager->fd;
  pcVar2 = pPager->zWal;
  iVar3 = pPager->journalSizeLimit;
  pPager->pWal = (Wal *)0x0;
  pWal = (Wal *)sqlite3MallocZero((long)psVar1->szOsFile + 0x90);
  if (pWal == (Wal *)0x0) {
    iVar5 = 7;
  }
  else {
    pWal->pVfs = psVar1;
    pWal->pWalFd = (sqlite3_file *)(pWal + 1);
    pWal->pDbFd = local_38;
    pWal->readLock = -1;
    pWal->mxWalSize = iVar3;
    pWal->zWalName = pcVar2;
    pWal->syncHeader = '\x01';
    pWal->padToSectorBoundary = '\x01';
    pWal->exclusiveMode = uVar7;
    local_3c = 0x80006;
    iVar5 = (*psVar1->xOpen)(psVar1,pcVar2,(sqlite3_file *)(pWal + 1),0x80006,(int *)&local_3c);
    if (iVar5 == 0) {
      if ((local_3c & 1) != 0) {
        pWal->readOnly = '\x01';
      }
      uVar6 = (*local_38->pMethods->xDeviceCharacteristics)(local_38);
      if ((uVar6 >> 10 & 1) != 0) {
        pWal->syncHeader = '\0';
      }
      if ((uVar6 >> 0xc & 1) != 0) {
        pWal->padToSectorBoundary = '\0';
      }
      pPager->pWal = pWal;
      iVar5 = 0;
    }
    else {
      walIndexClose(pWal,0);
      psVar4 = pWal->pWalFd;
      if (psVar4->pMethods != (sqlite3_io_methods *)0x0) {
        (*psVar4->pMethods->xClose)(psVar4);
        psVar4->pMethods = (sqlite3_io_methods *)0x0;
      }
      sqlite3_free(pWal);
    }
  }
LAB_0014a257:
  pagerFixMaplimit(pPager);
  return iVar5;
}

Assistant:

static int pagerOpenWal(Pager *pPager){
  int rc = SQLITE_OK;

  assert( pPager->pWal==0 && pPager->tempFile==0 );
  assert( pPager->eLock==SHARED_LOCK || pPager->eLock==EXCLUSIVE_LOCK );

  /* If the pager is already in exclusive-mode, the WAL module will use 
  ** heap-memory for the wal-index instead of the VFS shared-memory 
  ** implementation. Take the exclusive lock now, before opening the WAL
  ** file, to make sure this is safe.
  */
  if( pPager->exclusiveMode ){
    rc = pagerExclusiveLock(pPager);
  }

  /* Open the connection to the log file. If this operation fails, 
  ** (e.g. due to malloc() failure), return an error code.
  */
  if( rc==SQLITE_OK ){
    rc = sqlite3WalOpen(pPager->pVfs,
        pPager->fd, pPager->zWal, pPager->exclusiveMode,
        pPager->journalSizeLimit, &pPager->pWal
    );
  }
  pagerFixMaplimit(pPager);

  return rc;
}